

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer2impl.h
# Opt level: O3

UBool __thiscall
icu_63::Normalizer2Impl::hasCompBoundaryAfter(Normalizer2Impl *this,UChar32 c,UBool onlyContiguous)

{
  uint16_t uVar1;
  bool bVar2;
  
  uVar1 = getNorm16(this,c);
  if ((uVar1 & 1) == 0) {
    bVar2 = false;
  }
  else {
    bVar2 = true;
    if ((onlyContiguous != '\0') && (uVar1 != 1)) {
      if (uVar1 < this->limitNoNo) {
        bVar2 = *(ushort *)((long)this->extraData + (ulong)(uVar1 & 0xfffe)) < 0x200;
      }
      else {
        bVar2 = (uVar1 & 6) < 3;
      }
    }
  }
  return bVar2;
}

Assistant:

UBool hasCompBoundaryAfter(UChar32 c, UBool onlyContiguous) const {
        return norm16HasCompBoundaryAfter(getNorm16(c), onlyContiguous);
    }